

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pettyprof.h
# Opt level: O3

void pepro::impl::ProfileStack::pop(void)

{
  char *__s;
  ProfileStack *this;
  long lVar1;
  ProfileStack *pPVar2;
  size_t sVar3;
  ostream *poVar4;
  _Elt_pointer pEVar5;
  
  this = inst();
  pEVar5 = (this->m_stack).c.
           super__Deque_base<pepro::impl::ProfileStack::Entry,_std::allocator<pepro::impl::ProfileStack::Entry>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pEVar5 == (this->m_stack).c.
                super__Deque_base<pepro::impl::ProfileStack::Entry,_std::allocator<pepro::impl::ProfileStack::Entry>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pEVar5 = (this->m_stack).c.
             super__Deque_base<pepro::impl::ProfileStack::Entry,_std::allocator<pepro::impl::ProfileStack::Entry>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  lVar1 = std::chrono::_V2::system_clock::now();
  lVar1 = (lVar1 - pEVar5[-1].start.__d.__r) / 1000000;
  pPVar2 = inst();
  if ((pPVar2->m_outputThreshold).__r <= lVar1 * 1000000) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"PEPRO ",6);
    __s = pEVar5[-1].name;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1e85c8);
    }
    else {
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":\t",2);
    poVar4 = std::ostream::_M_insert<double>((double)lVar1 / 1000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," (s)",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  (pEVar5[-1].mark)->popOnDestruction = false;
  std::deque<pepro::impl::ProfileStack::Entry,_std::allocator<pepro::impl::ProfileStack::Entry>_>::
  pop_back((deque<pepro::impl::ProfileStack::Entry,_std::allocator<pepro::impl::ProfileStack::Entry>_>
            *)this);
  return;
}

Assistant:

static void pop ()
	{
		auto& stack = inst().m_stack;
		const auto& e = stack.top();
		const auto dur = std::chrono::duration_cast<std::chrono::milliseconds>(clock::now() - e.start);
		if (dur >= inst().m_outputThreshold)
			std::cout << "PEPRO " << e.name << ":\t" << dur.count() / 1.e3 << " (s)" << std::endl;
		e.mark->popOnDestruction = false;
		stack.pop();
	}